

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.h
# Opt level: O1

void fe_mul(int32_t *h,int32_t *f,int32_t *g)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  
  lVar13 = (long)*f;
  lVar29 = (long)*g;
  lVar23 = (long)g[1];
  lVar28 = (long)g[2];
  lVar34 = (long)g[3];
  lVar37 = (long)g[4];
  lVar35 = (long)g[5];
  lVar10 = (long)g[6];
  lVar26 = (long)g[7];
  lVar19 = (long)g[8];
  lVar9 = (long)g[9] * 0x13;
  lVar31 = (long)f[1];
  lVar7 = lVar31 * 2;
  lVar30 = lVar19 * 0x13;
  lVar32 = (long)f[2];
  lVar4 = lVar26 * 0x13;
  lVar42 = (long)f[3];
  lVar27 = lVar42 * 2;
  lVar5 = lVar10 * 0x13;
  lVar39 = (long)f[4];
  lVar15 = (long)f[5];
  lVar36 = lVar15 * 2;
  lVar6 = lVar37 * 0x13;
  lVar18 = lVar35 * 0x13;
  lVar20 = (long)f[6];
  lVar21 = (long)f[7];
  lVar2 = lVar34 * 0x13;
  lVar38 = lVar21 * 2;
  lVar16 = (long)f[8];
  lVar24 = (long)f[9];
  lVar41 = lVar24 * 2;
  lVar11 = lVar23 * lVar41 * 0x13 + lVar28 * 0x13 * lVar16 + lVar29 * lVar13 +
           lVar2 * lVar38 + lVar6 * lVar20 + lVar18 * lVar36 +
           lVar5 * lVar39 + lVar4 * lVar27 + lVar30 * lVar32 + lVar7 * lVar9;
  lVar22 = lVar18 * lVar41 +
           lVar29 * lVar39 + lVar28 * lVar32 + lVar23 * lVar27 + lVar34 * lVar7 + lVar37 * lVar13 +
           lVar5 * lVar16 + lVar4 * lVar38 + lVar30 * lVar20 + lVar36 * lVar9;
  uVar12 = lVar11 + 0x2000000;
  lVar14 = ((long)uVar12 >> 0x1a) +
           lVar28 * 0x13 * lVar24 + lVar29 * lVar31 + lVar23 * lVar13 +
           lVar2 * lVar16 + lVar6 * lVar21 + lVar18 * lVar20 + lVar5 * lVar15 + lVar4 * lVar39 +
           lVar42 * lVar30 + lVar32 * lVar9;
  uVar8 = lVar22 + 0x2000000;
  lVar40 = ((long)uVar8 >> 0x1a) +
           lVar5 * lVar24 +
           lVar29 * lVar15 + lVar23 * lVar39 + lVar28 * lVar42 + lVar34 * lVar32 +
           lVar37 * lVar31 + lVar35 * lVar13 + lVar4 * lVar16 + lVar21 * lVar30 + lVar20 * lVar9;
  lVar1 = lVar14 + 0x1000000;
  lVar17 = (lVar1 >> 0x19) +
           lVar2 * lVar41 + lVar29 * lVar32 + lVar28 * lVar13 + lVar23 * lVar7 +
           lVar6 * lVar16 + lVar18 * lVar38 + lVar5 * lVar20 + lVar4 * lVar36 + lVar30 * lVar39 +
           lVar27 * lVar9;
  lVar2 = lVar40 + 0x1000000;
  lVar25 = (lVar2 >> 0x19) +
           lVar4 * lVar41 +
           lVar29 * lVar20 + lVar28 * lVar39 + lVar23 * lVar36 + lVar34 * lVar27 + lVar37 * lVar32 +
           lVar35 * lVar7 + lVar10 * lVar13 + lVar30 * lVar16 + lVar38 * lVar9;
  lVar3 = lVar17 + 0x2000000;
  lVar33 = (lVar3 >> 0x1a) +
           lVar6 * lVar24 + lVar29 * lVar42 + lVar23 * lVar32 + lVar28 * lVar31 + lVar34 * lVar13 +
           lVar18 * lVar16 + lVar5 * lVar21 + lVar4 * lVar20 + lVar15 * lVar30 + lVar39 * lVar9;
  lVar4 = lVar25 + 0x2000000;
  lVar30 = (lVar4 >> 0x1a) +
           lVar30 * lVar24 +
           lVar29 * lVar21 + lVar23 * lVar20 + lVar28 * lVar15 + lVar34 * lVar39 +
           lVar37 * lVar42 + lVar35 * lVar32 + lVar10 * lVar31 + lVar26 * lVar13 + lVar16 * lVar9;
  lVar5 = lVar33 + 0x1000000;
  lVar18 = (lVar5 >> 0x19) + (lVar22 - (uVar8 & 0xfffffffffc000000));
  lVar6 = lVar30 + 0x1000000;
  lVar36 = (lVar6 >> 0x19) +
           lVar9 * lVar41 +
           lVar29 * lVar16 + lVar28 * lVar20 + lVar23 * lVar38 + lVar34 * lVar36 + lVar37 * lVar39 +
           lVar35 * lVar27 + lVar10 * lVar32 + lVar26 * lVar7 + lVar19 * lVar13;
  uVar8 = lVar18 + 0x2000000;
  lVar7 = lVar36 + 0x2000000;
  lVar41 = (lVar7 >> 0x1a) +
           lVar29 * lVar24 + lVar23 * lVar16 + lVar28 * lVar21 + lVar34 * lVar20 +
           lVar37 * lVar15 + lVar35 * lVar39 + lVar10 * lVar42 +
           lVar26 * lVar32 + lVar19 * lVar31 + g[9] * lVar13;
  lVar27 = lVar41 + 0x1000000;
  lVar38 = (lVar27 >> 0x19) * 0x13 + (lVar11 - (uVar12 & 0xfffffffffc000000));
  uVar12 = lVar38 + 0x2000000;
  *h = (int)lVar38 - ((uint)uVar12 & 0xfc000000);
  h[1] = (int)(uVar12 >> 0x1a) + ((int)lVar14 - ((uint)lVar1 & 0xfe000000));
  h[2] = (int)lVar17 - ((uint)lVar3 & 0xfc000000);
  h[3] = (int)lVar33 - ((uint)lVar5 & 0xfe000000);
  h[4] = (int)lVar18 - ((uint)uVar8 & 0xfc000000);
  h[5] = (int)(uVar8 >> 0x1a) + ((int)lVar40 - ((uint)lVar2 & 0xfe000000));
  h[6] = (int)lVar25 - ((uint)lVar4 & 0xfc000000);
  h[7] = (int)lVar30 - ((uint)lVar6 & 0xfe000000);
  h[8] = (int)lVar36 - ((uint)lVar7 & 0xfc000000);
  h[9] = (int)lVar41 - ((uint)lVar27 & 0xfe000000);
  return;
}

Assistant:

static void fe_mul(fe h, const fe f, const fe g)
{
    int32_t f0 = f[0];
    int32_t f1 = f[1];
    int32_t f2 = f[2];
    int32_t f3 = f[3];
    int32_t f4 = f[4];
    int32_t f5 = f[5];
    int32_t f6 = f[6];
    int32_t f7 = f[7];
    int32_t f8 = f[8];
    int32_t f9 = f[9];
    int32_t g0 = g[0];
    int32_t g1 = g[1];
    int32_t g2 = g[2];
    int32_t g3 = g[3];
    int32_t g4 = g[4];
    int32_t g5 = g[5];
    int32_t g6 = g[6];
    int32_t g7 = g[7];
    int32_t g8 = g[8];
    int32_t g9 = g[9];
    int32_t g1_19 = 19 * g1; /* 1.959375*2^29 */
    int32_t g2_19 = 19 * g2; /* 1.959375*2^30; still ok */
    int32_t g3_19 = 19 * g3;
    int32_t g4_19 = 19 * g4;
    int32_t g5_19 = 19 * g5;
    int32_t g6_19 = 19 * g6;
    int32_t g7_19 = 19 * g7;
    int32_t g8_19 = 19 * g8;
    int32_t g9_19 = 19 * g9;
    int32_t f1_2 = 2 * f1;
    int32_t f3_2 = 2 * f3;
    int32_t f5_2 = 2 * f5;
    int32_t f7_2 = 2 * f7;
    int32_t f9_2 = 2 * f9;
    int64_t f0g0    = f0   * (int64_t) g0;
    int64_t f0g1    = f0   * (int64_t) g1;
    int64_t f0g2    = f0   * (int64_t) g2;
    int64_t f0g3    = f0   * (int64_t) g3;
    int64_t f0g4    = f0   * (int64_t) g4;
    int64_t f0g5    = f0   * (int64_t) g5;
    int64_t f0g6    = f0   * (int64_t) g6;
    int64_t f0g7    = f0   * (int64_t) g7;
    int64_t f0g8    = f0   * (int64_t) g8;
    int64_t f0g9    = f0   * (int64_t) g9;
    int64_t f1g0    = f1   * (int64_t) g0;
    int64_t f1g1_2  = f1_2 * (int64_t) g1;
    int64_t f1g2    = f1   * (int64_t) g2;
    int64_t f1g3_2  = f1_2 * (int64_t) g3;
    int64_t f1g4    = f1   * (int64_t) g4;
    int64_t f1g5_2  = f1_2 * (int64_t) g5;
    int64_t f1g6    = f1   * (int64_t) g6;
    int64_t f1g7_2  = f1_2 * (int64_t) g7;
    int64_t f1g8    = f1   * (int64_t) g8;
    int64_t f1g9_38 = f1_2 * (int64_t) g9_19;
    int64_t f2g0    = f2   * (int64_t) g0;
    int64_t f2g1    = f2   * (int64_t) g1;
    int64_t f2g2    = f2   * (int64_t) g2;
    int64_t f2g3    = f2   * (int64_t) g3;
    int64_t f2g4    = f2   * (int64_t) g4;
    int64_t f2g5    = f2   * (int64_t) g5;
    int64_t f2g6    = f2   * (int64_t) g6;
    int64_t f2g7    = f2   * (int64_t) g7;
    int64_t f2g8_19 = f2   * (int64_t) g8_19;
    int64_t f2g9_19 = f2   * (int64_t) g9_19;
    int64_t f3g0    = f3   * (int64_t) g0;
    int64_t f3g1_2  = f3_2 * (int64_t) g1;
    int64_t f3g2    = f3   * (int64_t) g2;
    int64_t f3g3_2  = f3_2 * (int64_t) g3;
    int64_t f3g4    = f3   * (int64_t) g4;
    int64_t f3g5_2  = f3_2 * (int64_t) g5;
    int64_t f3g6    = f3   * (int64_t) g6;
    int64_t f3g7_38 = f3_2 * (int64_t) g7_19;
    int64_t f3g8_19 = f3   * (int64_t) g8_19;
    int64_t f3g9_38 = f3_2 * (int64_t) g9_19;
    int64_t f4g0    = f4   * (int64_t) g0;
    int64_t f4g1    = f4   * (int64_t) g1;
    int64_t f4g2    = f4   * (int64_t) g2;
    int64_t f4g3    = f4   * (int64_t) g3;
    int64_t f4g4    = f4   * (int64_t) g4;
    int64_t f4g5    = f4   * (int64_t) g5;
    int64_t f4g6_19 = f4   * (int64_t) g6_19;
    int64_t f4g7_19 = f4   * (int64_t) g7_19;
    int64_t f4g8_19 = f4   * (int64_t) g8_19;
    int64_t f4g9_19 = f4   * (int64_t) g9_19;
    int64_t f5g0    = f5   * (int64_t) g0;
    int64_t f5g1_2  = f5_2 * (int64_t) g1;
    int64_t f5g2    = f5   * (int64_t) g2;
    int64_t f5g3_2  = f5_2 * (int64_t) g3;
    int64_t f5g4    = f5   * (int64_t) g4;
    int64_t f5g5_38 = f5_2 * (int64_t) g5_19;
    int64_t f5g6_19 = f5   * (int64_t) g6_19;
    int64_t f5g7_38 = f5_2 * (int64_t) g7_19;
    int64_t f5g8_19 = f5   * (int64_t) g8_19;
    int64_t f5g9_38 = f5_2 * (int64_t) g9_19;
    int64_t f6g0    = f6   * (int64_t) g0;
    int64_t f6g1    = f6   * (int64_t) g1;
    int64_t f6g2    = f6   * (int64_t) g2;
    int64_t f6g3    = f6   * (int64_t) g3;
    int64_t f6g4_19 = f6   * (int64_t) g4_19;
    int64_t f6g5_19 = f6   * (int64_t) g5_19;
    int64_t f6g6_19 = f6   * (int64_t) g6_19;
    int64_t f6g7_19 = f6   * (int64_t) g7_19;
    int64_t f6g8_19 = f6   * (int64_t) g8_19;
    int64_t f6g9_19 = f6   * (int64_t) g9_19;
    int64_t f7g0    = f7   * (int64_t) g0;
    int64_t f7g1_2  = f7_2 * (int64_t) g1;
    int64_t f7g2    = f7   * (int64_t) g2;
    int64_t f7g3_38 = f7_2 * (int64_t) g3_19;
    int64_t f7g4_19 = f7   * (int64_t) g4_19;
    int64_t f7g5_38 = f7_2 * (int64_t) g5_19;
    int64_t f7g6_19 = f7   * (int64_t) g6_19;
    int64_t f7g7_38 = f7_2 * (int64_t) g7_19;
    int64_t f7g8_19 = f7   * (int64_t) g8_19;
    int64_t f7g9_38 = f7_2 * (int64_t) g9_19;
    int64_t f8g0    = f8   * (int64_t) g0;
    int64_t f8g1    = f8   * (int64_t) g1;
    int64_t f8g2_19 = f8   * (int64_t) g2_19;
    int64_t f8g3_19 = f8   * (int64_t) g3_19;
    int64_t f8g4_19 = f8   * (int64_t) g4_19;
    int64_t f8g5_19 = f8   * (int64_t) g5_19;
    int64_t f8g6_19 = f8   * (int64_t) g6_19;
    int64_t f8g7_19 = f8   * (int64_t) g7_19;
    int64_t f8g8_19 = f8   * (int64_t) g8_19;
    int64_t f8g9_19 = f8   * (int64_t) g9_19;
    int64_t f9g0    = f9   * (int64_t) g0;
    int64_t f9g1_38 = f9_2 * (int64_t) g1_19;
    int64_t f9g2_19 = f9   * (int64_t) g2_19;
    int64_t f9g3_38 = f9_2 * (int64_t) g3_19;
    int64_t f9g4_19 = f9   * (int64_t) g4_19;
    int64_t f9g5_38 = f9_2 * (int64_t) g5_19;
    int64_t f9g6_19 = f9   * (int64_t) g6_19;
    int64_t f9g7_38 = f9_2 * (int64_t) g7_19;
    int64_t f9g8_19 = f9   * (int64_t) g8_19;
    int64_t f9g9_38 = f9_2 * (int64_t) g9_19;
    int64_t h0 = f0g0 + f1g9_38 + f2g8_19 + f3g7_38 + f4g6_19 + f5g5_38 + f6g4_19 + f7g3_38 + f8g2_19 + f9g1_38;
    int64_t h1 = f0g1 + f1g0    + f2g9_19 + f3g8_19 + f4g7_19 + f5g6_19 + f6g5_19 + f7g4_19 + f8g3_19 + f9g2_19;
    int64_t h2 = f0g2 + f1g1_2  + f2g0    + f3g9_38 + f4g8_19 + f5g7_38 + f6g6_19 + f7g5_38 + f8g4_19 + f9g3_38;
    int64_t h3 = f0g3 + f1g2    + f2g1    + f3g0    + f4g9_19 + f5g8_19 + f6g7_19 + f7g6_19 + f8g5_19 + f9g4_19;
    int64_t h4 = f0g4 + f1g3_2  + f2g2    + f3g1_2  + f4g0    + f5g9_38 + f6g8_19 + f7g7_38 + f8g6_19 + f9g5_38;
    int64_t h5 = f0g5 + f1g4    + f2g3    + f3g2    + f4g1    + f5g0    + f6g9_19 + f7g8_19 + f8g7_19 + f9g6_19;
    int64_t h6 = f0g6 + f1g5_2  + f2g4    + f3g3_2  + f4g2    + f5g1_2  + f6g0    + f7g9_38 + f8g8_19 + f9g7_38;
    int64_t h7 = f0g7 + f1g6    + f2g5    + f3g4    + f4g3    + f5g2    + f6g1    + f7g0    + f8g9_19 + f9g8_19;
    int64_t h8 = f0g8 + f1g7_2  + f2g6    + f3g5_2  + f4g4    + f5g3_2  + f6g2    + f7g1_2  + f8g0    + f9g9_38;
    int64_t h9 = f0g9 + f1g8    + f2g7    + f3g6    + f4g5    + f5g4    + f6g3    + f7g2    + f8g1    + f9g0   ;
    int64_t carry0;
    int64_t carry1;
    int64_t carry2;
    int64_t carry3;
    int64_t carry4;
    int64_t carry5;
    int64_t carry6;
    int64_t carry7;
    int64_t carry8;
    int64_t carry9;

    /* |h0| <= (1.65*1.65*2^52*(1+19+19+19+19)+1.65*1.65*2^50*(38+38+38+38+38))
     *   i.e. |h0| <= 1.4*2^60; narrower ranges for h2, h4, h6, h8
     * |h1| <= (1.65*1.65*2^51*(1+1+19+19+19+19+19+19+19+19))
     *   i.e. |h1| <= 1.7*2^59; narrower ranges for h3, h5, h7, h9 */

    carry0 = h0 + (1 << 25); h1 += carry0 >> 26; h0 -= carry0 & kTop38Bits;
    carry4 = h4 + (1 << 25); h5 += carry4 >> 26; h4 -= carry4 & kTop38Bits;
    /* |h0| <= 2^25 */
    /* |h4| <= 2^25 */
    /* |h1| <= 1.71*2^59 */
    /* |h5| <= 1.71*2^59 */

    carry1 = h1 + (1 << 24); h2 += carry1 >> 25; h1 -= carry1 & kTop39Bits;
    carry5 = h5 + (1 << 24); h6 += carry5 >> 25; h5 -= carry5 & kTop39Bits;
    /* |h1| <= 2^24; from now on fits into int32 */
    /* |h5| <= 2^24; from now on fits into int32 */
    /* |h2| <= 1.41*2^60 */
    /* |h6| <= 1.41*2^60 */

    carry2 = h2 + (1 << 25); h3 += carry2 >> 26; h2 -= carry2 & kTop38Bits;
    carry6 = h6 + (1 << 25); h7 += carry6 >> 26; h6 -= carry6 & kTop38Bits;
    /* |h2| <= 2^25; from now on fits into int32 unchanged */
    /* |h6| <= 2^25; from now on fits into int32 unchanged */
    /* |h3| <= 1.71*2^59 */
    /* |h7| <= 1.71*2^59 */

    carry3 = h3 + (1 << 24); h4 += carry3 >> 25; h3 -= carry3 & kTop39Bits;
    carry7 = h7 + (1 << 24); h8 += carry7 >> 25; h7 -= carry7 & kTop39Bits;
    /* |h3| <= 2^24; from now on fits into int32 unchanged */
    /* |h7| <= 2^24; from now on fits into int32 unchanged */
    /* |h4| <= 1.72*2^34 */
    /* |h8| <= 1.41*2^60 */

    carry4 = h4 + (1 << 25); h5 += carry4 >> 26; h4 -= carry4 & kTop38Bits;
    carry8 = h8 + (1 << 25); h9 += carry8 >> 26; h8 -= carry8 & kTop38Bits;
    /* |h4| <= 2^25; from now on fits into int32 unchanged */
    /* |h8| <= 2^25; from now on fits into int32 unchanged */
    /* |h5| <= 1.01*2^24 */
    /* |h9| <= 1.71*2^59 */

    carry9 = h9 + (1 << 24); h0 += (carry9 >> 25) * 19; h9 -= carry9 & kTop39Bits;
    /* |h9| <= 2^24; from now on fits into int32 unchanged */
    /* |h0| <= 1.1*2^39 */

    carry0 = h0 + (1 << 25); h1 += carry0 >> 26; h0 -= carry0 & kTop38Bits;
    /* |h0| <= 2^25; from now on fits into int32 unchanged */
    /* |h1| <= 1.01*2^24 */

    h[0] = (int32_t)h0;
    h[1] = (int32_t)h1;
    h[2] = (int32_t)h2;
    h[3] = (int32_t)h3;
    h[4] = (int32_t)h4;
    h[5] = (int32_t)h5;
    h[6] = (int32_t)h6;
    h[7] = (int32_t)h7;
    h[8] = (int32_t)h8;
    h[9] = (int32_t)h9;
}